

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O1

Output * __thiscall
ftxui::TerminalInputParser::ParseCursorReporting
          (Output *__return_storage_ptr__,TerminalInputParser *this,
          vector<int,_std::allocator<int>_> *arguments)

{
  Motion *pMVar1;
  
  pMVar1 = (Motion *)
           (arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(arguments->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar1 == 8) {
    __return_storage_ptr__->type = CURSOR_REPORTING;
    (__return_storage_ptr__->field_1).mouse.motion = *pMVar1;
    (__return_storage_ptr__->field_1).mouse.button = pMVar1[1];
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->type = SPECIAL;
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseCursorReporting(
    std::vector<int> arguments) {
  if (arguments.size() != 2)
    return SPECIAL;
  Output output(CURSOR_REPORTING);
  output.cursor.y = arguments[0];
  output.cursor.x = arguments[1];
  return output;
}